

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_utils.cc
# Opt level: O3

int __thiscall
lf::base::LineFeedFormatter::clone
          (LineFeedFormatter *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int *p_Var1;
  pointer __p;
  _func_int **pp_Var2;
  pointer *__ptr;
  _func_int *local_18;
  __uniq_ptr_impl<lf::base::LineFeedFormatter,_std::default_delete<lf::base::LineFeedFormatter>_>
  local_10;
  
  (**(code **)(**(long **)(__fn + 8) + 0x18))(&local_18,*(long **)(__fn + 8),__child_stack,___flags)
  ;
  pp_Var2 = (_func_int **)operator_new(0x10);
  p_Var1 = local_18;
  local_18 = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR__LineFeedFormatter_001fcdf8;
  pp_Var2[1] = p_Var1;
  local_10._M_t.
  super__Tuple_impl<0UL,_lf::base::LineFeedFormatter_*,_std::default_delete<lf::base::LineFeedFormatter>_>
  .super__Head_base<0UL,_lf::base::LineFeedFormatter_*,_false>._M_head_impl =
       (tuple<lf::base::LineFeedFormatter_*,_std::default_delete<lf::base::LineFeedFormatter>_>)
       (_Tuple_impl<0UL,_lf::base::LineFeedFormatter_*,_std::default_delete<lf::base::LineFeedFormatter>_>
        )0x0;
  (this->super_formatter)._vptr_formatter = pp_Var2;
  std::unique_ptr<lf::base::LineFeedFormatter,_std::default_delete<lf::base::LineFeedFormatter>_>::
  ~unique_ptr((unique_ptr<lf::base::LineFeedFormatter,_std::default_delete<lf::base::LineFeedFormatter>_>
               *)&local_10);
  if (local_18 != (_func_int *)0x0) {
    (**(code **)(*(long *)local_18 + 8))();
  }
  return (int)this;
}

Assistant:

std::unique_ptr<spdlog::formatter> LineFeedFormatter::clone() const {
  return std::make_unique<LineFeedFormatter>(wrapped_formatter_->clone());
}